

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

void __thiscall sjtu::TrainManager::query_ticket(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar1;
  char *pcVar2;
  TrainManager *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  pair<unsigned_int,_bool> pVar8;
  pair<unsigned_int,_bool> pVar9;
  long *plVar10;
  trainType *this_01;
  recordType *prVar11;
  ostream *poVar12;
  long *plVar13;
  invalid_command *this_02;
  ulong uVar14;
  int iVar15;
  recordType *prVar16;
  uint uVar17;
  string *psVar18;
  long lVar19;
  vector<sjtu::recordType> records;
  string keyword;
  string date;
  string station [2];
  recordType rec;
  uint bits [2] [512];
  vector<sjtu::recordType> local_11d8;
  int local_11c4;
  TrainManager *local_11c0;
  long *local_11b8 [2];
  long local_11a8 [2];
  undefined1 *local_1198;
  long local_1190;
  undefined1 local_1188;
  undefined7 uStack_1187;
  long local_1178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1170;
  long *local_1168;
  long local_1160;
  long local_1158 [2];
  long *local_1148;
  long local_1140;
  long local_1138 [2];
  string local_1128;
  long local_1108;
  long local_1100;
  long local_10e8 [4];
  recordType local_10c8;
  ulong local_1038 [256];
  uint local_838 [514];
  undefined4 extraout_var;
  
  lVar7 = 0x10;
  do {
    *(undefined1 **)((long)&local_1128.field_2 + lVar7) = (undefined1 *)((long)&local_1108 + lVar7);
    *(undefined8 *)((long)&local_1128.field_2 + lVar7 + 8) = 0;
    *(undefined1 *)((long)&local_1108 + lVar7) = 0;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x50);
  local_1198 = &local_1188;
  local_1190 = 0;
  local_1188 = 0;
  local_11b8[0] = local_11a8;
  local_11c0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11b8,"");
  if (0 < argc) {
    iVar15 = 0;
    do {
      iVar4 = std::__cxx11::string::compare((char *)argv);
      psVar18 = (string *)&local_1108;
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)argv);
        psVar18 = (string *)local_10e8;
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)argv);
          psVar18 = (string *)&local_1198;
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)argv);
            psVar18 = (string *)local_11b8;
            if (iVar4 != 0) {
              this_02 = (invalid_command *)__cxa_allocate_exception(0x68);
              invalid_command::invalid_command(this_02);
              __cxa_throw(this_02,&invalid_command::typeinfo,invalid_command::~invalid_command);
            }
          }
        }
      }
      std::__cxx11::string::_M_assign(psVar18);
      argv = argv + 2;
      iVar15 = iVar15 + 2;
    } while (iVar15 < argc);
  }
  this_00 = local_11c0;
  pBVar1 = local_11c0->StationBpTree;
  local_1148 = local_1138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1148,local_1108,local_1100 + local_1108);
  if (local_1140 == 0) {
    local_1038[0] = 0;
  }
  else {
    lVar19 = 0;
    lVar7 = 0;
    local_1038[0] = 0;
    do {
      lVar7 = ((long)*(char *)((long)local_1148 + lVar19) + lVar7 * 0x239 + 0x100) % 0x3b800001;
      local_1038[0] =
           (long)((long)*(char *)((long)local_1148 + lVar19) + local_1038[0] * 0x301 + 0x100) %
           0x3b9aca07;
      lVar19 = lVar19 + 1;
    } while (local_1140 != lVar19);
    local_1038[0] = lVar7 << 0x20 | local_1038[0];
  }
  pVar8 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (pBVar1,local_1038);
  if (local_1148 != local_1138) {
    operator_delete(local_1148,local_1138[0] + 1);
  }
  pBVar1 = this_00->StationBpTree;
  local_1168 = local_1158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1168,local_10e8[0],local_10e8[1] + local_10e8[0]);
  if (local_1160 == 0) {
    local_1038[0] = 0;
  }
  else {
    lVar19 = 0;
    lVar7 = 0;
    local_1038[0] = 0;
    do {
      lVar7 = ((long)*(char *)((long)local_1168 + lVar19) + lVar7 * 0x239 + 0x100) % 0x3b800001;
      local_1038[0] =
           (long)((long)*(char *)((long)local_1168 + lVar19) + local_1038[0] * 0x301 + 0x100) %
           0x3b9aca07;
      lVar19 = lVar19 + 1;
    } while (local_1160 != lVar19);
    local_1038[0] = lVar7 << 0x20 | local_1038[0];
  }
  pVar9 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (pBVar1,local_1038);
  if (local_1168 != local_1158) {
    operator_delete(local_1168,local_1158[0] + 1);
  }
  if (((ulong)pVar9 >> 0x20 & 1) == 0 || ((ulong)pVar8 >> 0x20 & 1) == 0) {
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
  }
  else {
    bitset_query(this_00,pVar8.first,(uint *)local_1038);
    bitset_query(this_00,pVar9.first,local_838);
    local_11d8.maxSize = 10;
    local_11d8.data = (recordType *)operator_new(0x5a0);
    local_11d8.currentLength = 0;
    lVar7 = 0;
    do {
      uVar5 = *(uint *)((long)local_1038 + lVar7 * 4) & local_838[lVar7];
      *(uint *)((long)local_1038 + lVar7 * 4) = uVar5;
      if (uVar5 != 0) {
        local_11c4 = (int)lVar7 * 0x20 + 1;
        local_1178 = lVar7;
        do {
          uVar17 = -uVar5 & uVar5;
          uVar6 = uVar5;
          if (uVar17 != 0) {
            iVar15 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            local_10c8.trainID._M_dataplus._M_p = (pointer)((long)(iVar15 + local_11c4) * 0xa7a8);
            iVar15 = (*(local_11c0->TrainFile->super_FileManager_Base<sjtu::trainType>).
                       _vptr_FileManager_Base[2])();
            this_01 = (trainType *)CONCAT44(extraout_var,iVar15);
            prVar11 = (recordType *)operator_new(0x90);
            local_1170 = &(prVar11->trainID).field_2;
            (prVar11->trainID)._M_dataplus._M_p = (pointer)local_1170;
            (prVar11->trainID)._M_string_length = 0;
            (prVar11->trainID).field_2._M_local_buf[0] = '\0';
            lVar7 = 0x30;
            do {
              *(long *)((long)prVar11->station + lVar7 + -0x30) =
                   (long)&(((recordType *)(prVar11->station + -1))->trainID)._M_dataplus._M_p +
                   lVar7;
              *(undefined8 *)((long)prVar11->station + lVar7 + -0x28) = 0;
              *(undefined1 *)
               ((long)&(((recordType *)(prVar11->station + -1))->trainID)._M_dataplus._M_p + lVar7)
                   = 0;
              lVar7 = lVar7 + 0x20;
            } while (lVar7 != 0x70);
            prVar11->time[1].month = 0;
            prVar11->time[1].day = 0;
            prVar11->time[1].hour = 0;
            prVar11->time[1].minute = 0;
            prVar11->time[0].month = 0;
            prVar11->time[0].day = 0;
            prVar11->time[0].hour = 0;
            prVar11->time[0].minute = 0;
            pcVar2 = (char *)(prVar11->trainID)._M_string_length;
            strlen((char *)this_01);
            std::__cxx11::string::_M_replace((ulong)prVar11,0,pcVar2,(ulong)this_01);
            std::__cxx11::string::_M_assign((string *)prVar11->station);
            std::__cxx11::string::_M_assign((string *)(prVar11->station + 1));
            local_1128._M_dataplus._M_p = (pointer)&local_1128.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1128,local_1198,local_1198 + local_1190);
            timeType::timeType((timeType *)&local_10c8,&local_1128);
            *(pointer *)prVar11->time = local_10c8.trainID._M_dataplus._M_p;
            prVar11->time[0].hour = (undefined4)local_10c8.trainID._M_string_length;
            prVar11->time[0].minute = local_10c8.trainID._M_string_length._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1128._M_dataplus._M_p != &local_1128.field_2) {
              operator_delete(local_1128._M_dataplus._M_p,
                              local_1128.field_2._M_allocated_capacity + 1);
            }
            bVar3 = trainType::getrecord(this_01,prVar11,false);
            if (bVar3) {
              vector<sjtu::recordType>::push_back(&local_11d8,prVar11);
            }
            lVar7 = 0x50;
            do {
              plVar10 = (long *)((long)&(((recordType *)(prVar11->station + -1))->trainID).
                                        _M_dataplus._M_p + lVar7);
              plVar13 = *(long **)((long)prVar11->station + lVar7 + -0x30);
              if (plVar10 != plVar13) {
                operator_delete(plVar13,*plVar10 + 1);
              }
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != 0x10);
            plVar10 = (long *)(prVar11->trainID)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar10 != local_1170) {
              operator_delete(plVar10,local_1170->_M_allocated_capacity + 1);
            }
            operator_delete(prVar11,0x90);
            uVar6 = *(uint *)((long)local_1038 + local_1178 * 4);
            lVar7 = local_1178;
          }
          uVar5 = uVar6 ^ uVar17;
          *(uint *)((long)local_1038 + lVar7 * 4) = uVar5;
        } while (uVar6 != uVar17);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x200);
    iVar15 = std::__cxx11::string::compare((char *)local_11b8);
    prVar11 = local_11d8.data;
    uVar14 = (ulong)local_11d8.currentLength;
    prVar16 = local_11d8.data + uVar14;
    if (iVar15 == 0) {
      if (local_11d8.currentLength != 0) {
        lVar7 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<sjtu::vector<sjtu::recordType>::iterator,long,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_time>>
                  (local_11d8.data,&local_11d8,prVar16,&local_11d8,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_time>>
                  (prVar11,&local_11d8,prVar16);
      }
    }
    else if (local_11d8.currentLength != 0) {
      lVar7 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<sjtu::vector<sjtu::recordType>::iterator,long,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                (local_11d8.data,&local_11d8,prVar16,&local_11d8,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                (prVar11,&local_11d8,prVar16);
    }
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    if ((long)local_11d8.currentLength != 0) {
      prVar16 = local_11d8.data + local_11d8.currentLength;
      prVar11 = local_11d8.data;
      do {
        recordType::recordType(&local_10c8,prVar11);
        poVar12 = operator<<((ostream *)&std::cout,&local_10c8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        lVar7 = 0x50;
        do {
          plVar13 = (long *)((long)&(((recordType *)(local_10c8.station + -1))->trainID)._M_dataplus
                                    ._M_p + lVar7);
          plVar10 = *(long **)((long)local_10e8 + lVar7 + 0x10);
          if (plVar13 != plVar10) {
            operator_delete(plVar10,*plVar13 + 1);
          }
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10c8.trainID._M_dataplus._M_p != &local_10c8.trainID.field_2) {
          operator_delete(local_10c8.trainID._M_dataplus._M_p,
                          local_10c8.trainID.field_2._M_allocated_capacity + 1);
        }
        prVar11 = prVar11 + 1;
      } while (prVar11 != prVar16);
    }
    vector<sjtu::recordType>::~vector(&local_11d8);
  }
  if (local_11b8[0] != local_11a8) {
    operator_delete(local_11b8[0],local_11a8[0] + 1);
  }
  if (local_1198 != &local_1188) {
    operator_delete(local_1198,CONCAT71(uStack_1187,local_1188) + 1);
  }
  lVar7 = -0x40;
  plVar10 = local_10e8 + 2;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  return;
}

Assistant:

void query_ticket(int argc , std::string *argv)
		{
			std::string station[2] , date , keyword = "";
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-s") station[0] = argv[i + 1];
				else if (argv[i] == "-t") station[1] = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else if (argv[i] == "-p") keyword = argv[i + 1];
				else throw invalid_command();
			auto ret_s = StationBpTree -> find(hasher(station[0])) , ret_t = StationBpTree -> find(hasher(station[1]));
			if (ret_s.second == false || ret_t.second == false) std::cout << 0 << std::endl;
			else
			{
				unsigned int bits[2][WS];
				bitset_query(ret_s.first , bits[0]) , bitset_query(ret_t.first , bits[1]);
				vector<recordType> records;
				recordType *record;
				for (int i = 0;i < WS;++ i)
				{
					bits[0][i] &= bits[1][i];
					for (unsigned int w;bits[0][i];bits[0][i] ^= w)
					{
						w = bits[0][i] & (-bits[0][i]);
						if (!w) continue;
						int id = -1;
						for (unsigned int w_ = w;w_;w_ >>= 1) ++ id;
						trainType *train = TrainFile -> read((i * W + id + 1) * sizeof (DynamicFileManager<trainType>::valueType));
						record = new recordType , record -> trainID = train -> trainID;
						record -> station[0] = station[0] , record -> station[1] = station[1];
						record -> time[0] = timeType(date);
						if (train -> getrecord(record)) records.push_back(*record);
						delete record;
					}
				}
				if (keyword == "time") std::sort(records.begin() , records.end() , cmp_time());
				else std::sort(records.begin() , records.end() , cmp_cost());
				std::cout << records.size() << std::endl;
				for (auto rec : records) std::cout << rec << std::endl;
			}
		}